

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  string local_c8 [32];
  location local_a8;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  text *local_28;
  text *decomposition__local;
  text *expr__local;
  location *where__local;
  failure *this_local;
  
  local_28 = decomposition_;
  decomposition__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"failed",&local_69);
  std::__cxx11::string::string(local_48,local_68);
  location::location(&local_a8,where_);
  std::operator+(local_108,(char *)expr_);
  std::operator+(local_e8,local_108);
  std::__cxx11::string::string(local_c8,(string *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"",&local_149);
  std::__cxx11::string::string(local_128,local_148);
  message::message(&this->super_message,(text *)local_48,&local_a8,(text *)local_c8,
                   (text *)local_128);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_108);
  location::~location(&local_a8);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *(undefined ***)&this->super_message = &PTR__failure_001db988;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}